

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O3

TrackChunk rlib::midi::Smf::Inner::read<rlib::midi::Smf::Inner::TrackChunk>(istream *is)

{
  long lVar1;
  runtime_error *this;
  TrackChunk local_18;
  
  builtin_memcpy(local_18.MTrk._M_elems,"MTrk",4);
  local_18.dataLength = 0;
  lVar1 = std::istream::read((char *)is,(long)&local_18);
  if (7 < *(ulong *)(lVar1 + 8)) {
    return local_18;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"size error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}